

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O0

void __thiscall OnDiskDataset::drop(OnDiskDataset *this)

{
  bool bVar1;
  OnDiskFileIndex *pOVar2;
  OnDiskDataset *in_RDI;
  string *in_stack_00000008;
  OnDiskDataset *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *idx_name;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  OnDiskIndex *indice;
  iterator __end1;
  iterator __begin1;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  idx_names;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *in_stack_ffffffffffffff68;
  __normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
  *in_stack_ffffffffffffff70;
  value_type *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined1 *local_58;
  reference local_40;
  OnDiskIndex *local_38;
  __normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_> local_30
  ;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *local_28;
  undefined1 local_20 [32];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18b046);
  local_28 = &in_RDI->indices;
  local_30._M_current =
       (OnDiskIndex *)
       std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::begin(in_stack_ffffffffffffff68);
  local_38 = (OnDiskIndex *)
             std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
               ::operator*(&local_30);
    in_stack_ffffffffffffff80 = OnDiskIndex::get_fname_abi_cxx11_(local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>::
    operator++(&local_30);
  }
  std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::clear
            ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)0x18b0f6);
  local_58 = local_20;
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffff68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_60);
    drop_file(in_stack_00000010,in_stack_00000008);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_60);
  }
  pOVar2 = std::optional<OnDiskFileIndex>::operator->((optional<OnDiskFileIndex> *)0x18b16f);
  OnDiskFileIndex::get_files_fname_abi_cxx11_(pOVar2);
  drop_file(in_stack_00000010,in_stack_00000008);
  pOVar2 = std::optional<OnDiskFileIndex>::operator->((optional<OnDiskFileIndex> *)0x18b19d);
  OnDiskFileIndex::get_cache_fname_abi_cxx11_(pOVar2);
  drop_file(in_stack_00000010,in_stack_00000008);
  get_name_abi_cxx11_(in_RDI);
  drop_file(in_stack_00000010,in_stack_00000008);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void OnDiskDataset::drop() {
    std::vector<std::string> idx_names;

    for (auto &indice : indices) {
        idx_names.push_back(indice.get_fname());
    }

    // deallocate objects to close FDs
    indices.clear();

    for (auto &idx_name : idx_names) {
        drop_file(idx_name);
    }

    drop_file(files_index->get_files_fname());
    drop_file(files_index->get_cache_fname());
    drop_file(get_name());
}